

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

void __thiscall nv::Kernel1::Kernel1(Kernel1 *this,Filter *f,int iscale,int samples)

{
  float *pfVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float fVar8;
  
  fVar6 = f->m_width * (float)iscale;
  this->m_width = fVar6;
  fVar6 = ceilf(fVar6 + fVar6);
  uVar3 = (uint)fVar6;
  this->m_windowSize = uVar3;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)uVar3) {
    uVar2 = (long)(int)uVar3 * 4;
  }
  pfVar1 = (float *)operator_new__(uVar2);
  this->m_data = pfVar1;
  if (0 < (int)uVar3) {
    fVar7 = 0.0;
    lVar5 = 0;
    do {
      fVar8 = 0.0;
      if (0 < samples) {
        iVar4 = 0;
        do {
          (*f->_vptr_Filter[2])
                    ((((float)iVar4 + 0.5) * (1.0 / (float)samples) +
                     ((float)(int)lVar5 - (float)(int)fVar6 * 0.5)) * (1.0 / (float)iscale),f);
          fVar8 = fVar8 + extraout_XMM0_Da;
          iVar4 = iVar4 + 1;
        } while (samples != iVar4);
        pfVar1 = this->m_data;
        uVar3 = this->m_windowSize;
      }
      fVar8 = fVar8 * (1.0 / (float)samples);
      pfVar1[lVar5] = fVar8;
      fVar7 = fVar7 + fVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar3);
    if (0 < (int)uVar3) {
      uVar2 = 0;
      do {
        pfVar1[uVar2] = pfVar1[uVar2] * (1.0 / fVar7);
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
  }
  return;
}

Assistant:

Kernel1::Kernel1(const Filter & f, int iscale, int samples/*= 32*/)
{
	nvDebugCheck(iscale > 1);
	nvDebugCheck(samples > 0);
	
	const float scale = 1.0f / iscale;
	
	m_width = f.width() * iscale;
	m_windowSize = (int)ceilf(2 * m_width);
	m_data = new float[m_windowSize];
	
	const float offset = float(m_windowSize) / 2;
	
	float total = 0.0f;
	for (int i = 0; i < m_windowSize; i++)
	{
		const float sample = f.sampleBox(i - offset, scale, samples);
		m_data[i] = sample;
		total += sample;
	}
	
	const float inv = 1.0f / total;
	for (int i = 0; i < m_windowSize; i++)
	{
		m_data[i] *= inv;
	}
}